

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_4,_2>,_tcu::Matrix<double,_2,_4>_>::call
          (unary<tcu::Matrix<double,_4,_2>,_tcu::Matrix<double,_2,_4>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  int row_1;
  undefined8 *puVar9;
  GLdouble *data;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 *puVar13;
  bool bVar14;
  uint uVar15;
  Matrix<double,_4,_2> result;
  Matrix<double,_2,_4> arg;
  undefined8 local_d8 [8];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_50 [64];
  
  puVar9 = local_d8;
  puVar8 = local_d8;
  local_d8[6] = 0;
  local_d8[7] = 0;
  local_d8[4] = 0;
  local_d8[5] = 0;
  local_d8[2] = 0;
  local_d8[3] = 0;
  local_d8[0] = 0;
  local_d8[1] = 0;
  lVar10 = 0;
  lVar11 = 0;
  do {
    lVar12 = 0;
    do {
      uVar15 = 0x3ff00000;
      if (lVar10 != lVar12) {
        uVar15 = 0;
      }
      *(ulong *)((long)puVar9 + lVar12) = (ulong)uVar15 << 0x20;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 == 0x20);
    lVar11 = lVar11 + 1;
    puVar9 = (undefined8 *)((long)puVar9 + 8);
    lVar10 = lVar10 + 0x20;
  } while (lVar11 != 4);
  puVar9 = &local_98;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  lVar11 = 0;
  lVar10 = 0;
  do {
    lVar12 = 0;
    do {
      uVar15 = 0x3ff00000;
      if (lVar11 != lVar12) {
        uVar15 = 0;
      }
      *(ulong *)((long)puVar9 + lVar12) = (ulong)uVar15 << 0x20;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    puVar9 = puVar9 + 1;
    lVar11 = lVar11 + 0x10;
    bVar14 = lVar10 == 0;
    lVar10 = lVar10 + 1;
  } while (bVar14);
  lVar10 = 0;
  do {
    puVar1 = (undefined4 *)((long)argument_src + lVar10);
    uVar2 = puVar1[1];
    uVar3 = puVar1[2];
    uVar4 = puVar1[3];
    *(undefined4 *)((long)&local_98 + lVar10) = *puVar1;
    *(undefined4 *)((long)&local_98 + lVar10 + 4) = uVar2;
    *(undefined4 *)((long)&uStack_90 + lVar10) = uVar3;
    *(undefined4 *)((long)&uStack_90 + lVar10 + 4) = uVar4;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x40);
  puVar13 = local_50;
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(puVar13,&local_98);
  lVar10 = 0;
  do {
    lVar11 = 0;
    do {
      *(undefined8 *)((long)puVar8 + lVar11) = *(undefined8 *)(puVar13 + lVar11);
      lVar11 = lVar11 + 0x20;
    } while (lVar11 == 0x20);
    lVar10 = lVar10 + 1;
    puVar8 = (undefined8 *)((long)puVar8 + 8);
    puVar13 = puVar13 + 8;
  } while (lVar10 != 4);
  lVar10 = 0;
  do {
    uVar5 = *(undefined8 *)((long)local_d8 + lVar10);
    uVar6 = *(undefined8 *)((long)local_d8 + lVar10 + 8);
    uVar7 = *(undefined8 *)((long)local_d8 + lVar10 + 0x18);
    puVar8 = (undefined8 *)((long)result_dst + lVar10 + 0x10);
    *puVar8 = *(undefined8 *)((long)local_d8 + lVar10 + 0x10);
    puVar8[1] = uVar7;
    *(undefined8 *)((long)result_dst + lVar10) = uVar5;
    ((undefined8 *)((long)result_dst + lVar10))[1] = uVar6;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 == 0x20);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}